

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_tests.c
# Opt level: O3

cJSON_bool compare_from_string(char *a,char *b,cJSON_bool case_sensitive)

{
  cJSON_bool cVar1;
  cJSON *item;
  cJSON *b_00;
  
  item = cJSON_ParseWithOpts(a,(char **)0x0,0);
  if (item == (cJSON *)0x0) {
    UnityFail("Failed to parse a.",0x22);
  }
  b_00 = cJSON_ParseWithOpts(b,(char **)0x0,0);
  if (b_00 == (cJSON *)0x0) {
    UnityFail("Failed to parse b.",0x24);
    cJSON_Delete(item);
    cVar1 = 0;
  }
  else {
    cVar1 = cJSON_Compare(item,b_00,case_sensitive);
    cJSON_Delete(item);
    cJSON_Delete(b_00);
  }
  return cVar1;
}

Assistant:

static cJSON_bool compare_from_string(const char * const a, const char * const b, const cJSON_bool case_sensitive)
{
    cJSON *a_json = NULL;
    cJSON *b_json = NULL;
    cJSON_bool result = false;

    a_json = cJSON_Parse(a);
    TEST_ASSERT_NOT_NULL_MESSAGE(a_json, "Failed to parse a.");
    b_json = cJSON_Parse(b);
    TEST_ASSERT_NOT_NULL_MESSAGE(b_json, "Failed to parse b.");

    result = cJSON_Compare(a_json, b_json, case_sensitive);

    cJSON_Delete(a_json);
    cJSON_Delete(b_json);

    return result;
}